

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void google::protobuf::internal::PackedFieldHelper<8>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  bool bVar1;
  undefined8 in_RAX;
  bool *pbVar2;
  uint8_t *ptr;
  int index;
  RepeatedField<bool> *array;
  uint32_t local_28;
  undefined4 local_24;
  
  if (*field != 0) {
    _local_28 = CONCAT44((int)((ulong)in_RAX >> 0x20),md->tag);
    PrimitiveTypeHelper<13>::Serialize(&local_28,output);
    _local_28 = CONCAT44(*(undefined4 *)((long)field + 0x10),local_28);
    PrimitiveTypeHelper<13>::Serialize(&local_24,output);
    if (0 < *field) {
      index = 0;
      do {
        pbVar2 = RepeatedField<bool>::Get((RepeatedField<bool> *)field,index);
        bVar1 = *pbVar2;
        ptr = output->cur_;
        if ((output->impl_).end_ <= ptr) {
          ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,ptr);
        }
        output->cur_ = ptr;
        *ptr = bVar1;
        output->cur_ = ptr + 1;
        index = index + 1;
      } while (index < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}